

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O0

ostream * Lib::operator<<(ostream *out,
                         Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                         *self)

{
  bool bVar1;
  ostream *in_RDI;
  Renaming *in_stack_ffffffffffffffd8;
  ostream *local_8;
  
  bVar1 = Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::alive
                    ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
                     0x309a68);
  if (bVar1) {
    Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::self
              ((Recycled<Kernel::Renaming,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)0x309a82);
    local_8 = Kernel::operator<<(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    local_8 = std::operator<<(in_RDI,"Recycled(NULL)");
  }
  return local_8;
}

Assistant:

std::ostream& operator<<(std::ostream& out, Recycled const& self)
  { if (self.alive())return out << self.self(); else return out << "Recycled(NULL)"; }